

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

void __thiscall cashew::JSPrinter::printVar(JSPrinter *this,Ref node)

{
  uint uVar1;
  size_t *psVar2;
  Value *pVVar3;
  size_t sVar4;
  Ref *pRVar5;
  char *s;
  undefined8 *puVar6;
  ulong local_28;
  size_t i;
  Ref args;
  JSPrinter *this_local;
  Ref node_local;
  
  args.inst = (Value *)this;
  this_local = (JSPrinter *)node.inst;
  emit(this,"var ");
  psVar2 = (size_t *)cashew::Ref::operator[]((uint)&this_local);
  i = *psVar2;
  local_28 = 0;
  while( true ) {
    pVVar3 = Ref::operator->((Ref *)&i);
    sVar4 = Value::size(pVVar3);
    if (sVar4 <= local_28) break;
    if (local_28 != 0) {
      if ((this->pretty & 1U) == 0) {
        emit(this,',');
      }
      else {
        emit(this,", ");
      }
    }
    uVar1 = cashew::Ref::operator[]((uint)&i);
    pRVar5 = (Ref *)cashew::Ref::operator[](uVar1);
    pVVar3 = Ref::operator->(pRVar5);
    s = Value::getCString(pVVar3);
    emit(this,s);
    pRVar5 = (Ref *)cashew::Ref::operator[]((uint)&i);
    pVVar3 = Ref::operator->(pRVar5);
    sVar4 = Value::size(pVVar3);
    if (1 < sVar4) {
      space(this);
      emit(this,'=');
      space(this);
      uVar1 = cashew::Ref::operator[]((uint)&i);
      puVar6 = (undefined8 *)cashew::Ref::operator[](uVar1);
      print(this,(Value *)*puVar6);
    }
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void printVar(Ref node) {
    emit("var ");
    Ref args = node[1];
    for (size_t i = 0; i < args->size(); i++) {
      if (i > 0) {
        (pretty ? emit(", ") : emit(','));
      }
      emit(args[i][0]->getCString());
      if (args[i]->size() > 1) {
        space();
        emit('=');
        space();
        print(args[i][1]);
      }
    }
  }